

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_mdef_gen.c
# Opt level: O2

int32 count_triphones(char *transfile,dicthashelement_t **dicthash,hashelement_t **tphnhash,
                     phnhashelement_t ***phnhash,int ignore_wpos)

{
  long lVar1;
  int iVar2;
  FILE *__stream;
  phnhashelement_t **hashtable;
  lineiter_t *li;
  char *__s;
  char *pcVar3;
  void *__ptr;
  dicthashelement_t *pdVar4;
  size_t sVar5;
  phnhashelement_t *ppVar6;
  hashelement_t *phVar7;
  char *wp;
  char *wp_00;
  char *wp_01;
  char *pcVar8;
  undefined8 *puVar9;
  long lVar10;
  long lVar11;
  char *pcVar12;
  long lVar13;
  long lVar14;
  bool bVar15;
  char silencephn [4];
  uint local_a8;
  uint local_a4;
  uint local_a0;
  uint local_9c;
  ulong local_88;
  
  builtin_strncpy(silencephn,"SIL",4);
  __stream = fopen(transfile,"r");
  if (__stream != (FILE *)0x0) {
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
            ,0x1df,"Out of vocabulary words in transcript will be mapped to SIL!\n");
    hashtable = (phnhashelement_t **)calloc(0x65,0x18);
    li = lineiter_start_clean((FILE *)__stream);
    bVar15 = ignore_wpos != 0;
    wp = "b";
    if (bVar15) {
      wp = "i";
    }
    wp_00 = "e";
    if (bVar15) {
      wp_00 = "i";
    }
    wp_01 = "s";
    if (bVar15) {
      wp_01 = "i";
    }
    local_88 = 0;
    local_a4 = 0;
    local_9c = 0;
    local_a8 = 0;
    local_a0 = 0;
    for (; li != (lineiter_t *)0x0; li = lineiter_next(li)) {
      __s = strdup(li->buf);
      pcVar3 = strtok(__s," \t\n");
      if (pcVar3 != (char *)0x0) {
        lVar11 = 0;
        do {
          pcVar3 = strtok((char *)0x0," \t\n");
          lVar11 = lVar11 + -1;
        } while (pcVar3 != (char *)0x0);
        __ptr = __ckd_calloc__(2 - lVar11,8,
                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
                               ,0x1f1);
        pcVar3 = strtok(li->buf," \t\n");
        pdVar4 = dictlookup(pcVar3,dicthash);
        *(dicthashelement_t **)((long)__ptr + 8) = pdVar4;
        if (pdVar4 == (dicthashelement_t *)0x0) {
          err_msg(ERR_WARN,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
                  ,500,"Word %s not found in dictionary. Mapping to SIL.\n",pcVar3);
        }
        local_88 = (local_88 & 0xffffffff) - lVar11;
        puVar9 = (undefined8 *)((long)__ptr + 0x10);
        while (pcVar3 = strtok((char *)0x0," \t\n"), pcVar3 != (char *)0x0) {
          pdVar4 = dictlookup(pcVar3,dicthash);
          *puVar9 = pdVar4;
          if (((pdVar4 == (dicthashelement_t *)0x0) && (*pcVar3 != '(')) &&
             (sVar5 = strlen(pcVar3), pcVar3[sVar5 - 1] != ')')) {
            err_msg(ERR_WARN,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
                    ,0x1fb,"Word %s not found in dictionary. Mapping to SIL.\n",pcVar3);
          }
          puVar9 = puVar9 + 1;
        }
        for (lVar10 = 1; 1 - lVar11 != lVar10; lVar10 = lVar10 + 1) {
          lVar14 = *(long *)((long)__ptr + lVar10 * 8);
          if (lVar14 != 0) {
            lVar13 = (long)*(int *)(lVar14 + 0x10);
            pcVar3 = (char *)**(undefined8 **)(lVar14 + 8);
            ppVar6 = phninstall(pcVar3,hashtable);
            ppVar6->count = ppVar6->count + 1;
            if (lVar13 == 1) {
              if ((*pcVar3 != '+') && (iVar2 = strcmp(pcVar3,"SIL"), iVar2 != 0)) {
                lVar14 = *(long *)((long)__ptr + lVar10 * 8 + -8);
                pcVar12 = silencephn;
                if ((lVar14 != 0) &&
                   ((pcVar12 = *(char **)(*(long *)(lVar14 + 8) + -8 +
                                         (long)*(int *)(lVar14 + 0x10) * 8), *pcVar12 == '+' ||
                    (iVar2 = strcmp(pcVar12,"SIL"), iVar2 == 0)))) {
                  pcVar12 = silencephn;
                }
                lVar14 = *(long *)((long)__ptr + lVar10 * 8 + 8);
                pcVar8 = silencephn;
                if ((lVar14 != 0) &&
                   ((pcVar8 = (char *)**(undefined8 **)(lVar14 + 8), *pcVar8 == '+' ||
                    (iVar2 = strcmp(pcVar8,"SIL"), iVar2 == 0)))) {
                  pcVar8 = silencephn;
                }
                phVar7 = lookup(pcVar3,pcVar12,pcVar8,wp_01,tphnhash);
                phVar7->count = phVar7->count + 1;
                local_a4 = local_a4 + 1;
              }
            }
            else if ((*pcVar3 != '+') && (iVar2 = strcmp(pcVar3,"SIL"), iVar2 != 0)) {
              lVar14 = *(long *)((long)__ptr + lVar10 * 8 + -8);
              pcVar12 = silencephn;
              if ((lVar14 != 0) &&
                 ((pcVar12 = *(char **)(*(long *)(lVar14 + 8) + -8 +
                                       (long)*(int *)(lVar14 + 0x10) * 8), *pcVar12 == '+' ||
                  (iVar2 = strcmp(pcVar12,"SIL"), iVar2 == 0)))) {
                pcVar12 = silencephn;
              }
              pcVar8 = *(char **)(*(long *)(*(long *)((long)__ptr + lVar10 * 8) + 8) + 8);
              if ((*pcVar8 == '+') || (iVar2 = strcmp(pcVar8,"SIL"), iVar2 == 0)) {
                pcVar8 = silencephn;
              }
              phVar7 = lookup(pcVar3,pcVar12,pcVar8,wp,tphnhash);
              phVar7->count = phVar7->count + 1;
              for (lVar14 = 1; lVar14 < lVar13 + -1; lVar14 = lVar14 + 1) {
                pcVar3 = *(char **)(*(long *)(*(long *)((long)__ptr + lVar10 * 8) + 8) + lVar14 * 8)
                ;
                ppVar6 = phninstall(pcVar3,hashtable);
                ppVar6->count = ppVar6->count + 1;
                if ((*pcVar3 != '+') && (iVar2 = strcmp(pcVar3,"SIL"), iVar2 != 0)) {
                  lVar1 = *(long *)(*(long *)((long)__ptr + lVar10 * 8) + 8);
                  pcVar12 = *(char **)(lVar1 + -8 + lVar14 * 8);
                  if ((*pcVar12 == '+') || (iVar2 = strcmp(pcVar12,"SIL"), iVar2 == 0)) {
                    pcVar12 = silencephn;
                  }
                  pcVar8 = *(char **)(lVar1 + 8 + lVar14 * 8);
                  if ((*pcVar8 == '+') || (iVar2 = strcmp(pcVar8,"SIL"), iVar2 == 0)) {
                    pcVar8 = silencephn;
                  }
                  phVar7 = lookup(pcVar3,pcVar12,pcVar8,"i",tphnhash);
                  phVar7->count = phVar7->count + 1;
                  local_9c = local_9c + 1;
                }
              }
              local_a0 = local_a0 + 1;
              pcVar3 = *(char **)(*(long *)(*(long *)((long)__ptr + lVar10 * 8) + 8) + -8 +
                                 lVar13 * 8);
              ppVar6 = phninstall(pcVar3,hashtable);
              ppVar6->count = ppVar6->count + 1;
              if ((*pcVar3 != '+') && (iVar2 = strcmp(pcVar3,"SIL"), iVar2 != 0)) {
                pcVar12 = *(char **)(*(long *)(*(long *)((long)__ptr + lVar10 * 8) + 8) + -0x10 +
                                    lVar13 * 8);
                if ((*pcVar12 == '+') || (iVar2 = strcmp(pcVar12,"SIL"), iVar2 == 0)) {
                  pcVar12 = silencephn;
                }
                lVar14 = *(long *)((long)__ptr + lVar10 * 8 + 8);
                pcVar8 = silencephn;
                if ((lVar14 != 0) &&
                   ((pcVar8 = (char *)**(undefined8 **)(lVar14 + 8), *pcVar8 == '+' ||
                    (iVar2 = strcmp(pcVar8,"SIL"), iVar2 == 0)))) {
                  pcVar8 = silencephn;
                }
                phVar7 = lookup(pcVar3,pcVar12,pcVar8,wp_00,tphnhash);
                phVar7->count = phVar7->count + 1;
                local_a8 = local_a8 + 1;
              }
            }
          }
        }
        free(__ptr);
      }
      free(__s);
    }
    fclose(__stream);
    lineiter_free((lineiter_t *)0x0);
    *phnhash = hashtable;
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
            ,0x251,"%d words in transcripts\n",local_88);
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
            ,0x252,"%d single word triphones in transcripts\n",(ulong)local_a4);
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
            ,0x253,"%d word beginning triphones in transcripts\n",(ulong)local_a0);
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
            ,0x254,"%d word internal triphones in transcripts\n",(ulong)local_9c);
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
            ,0x255,"%d word ending triphones in transcripts\n",(ulong)local_a8);
    return 0;
  }
  err_msg(ERR_FATAL,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
          ,0x1dd,"Unable to open transcript file %s for reading!\n",transfile);
  exit(1);
}

Assistant:

int32  count_triphones (const char *transfile,
			dicthashelement_t **dicthash,
			hashelement_t **tphnhash,
			phnhashelement_t ***phnhash,
			int ignore_wpos)
{
    int32  nbwdtphns, newdtphns, niwdtphns, nswdtphns;
    int32  nwords, lnphns, n_totalwds;
    lineiter_t *line = NULL;
    char *tline;
    char   *word, *basephone, *lctxt, *rctxt; 
    char   silencephn[4];
    const char* wpos;
    int32  i, j;
    dicthashelement_t **wordarr;
    phnhashelement_t **lphnhash, *phnptr;
    hashelement_t *tphnptr;
    FILE   *fp;

    strcpy(silencephn,"SIL");
    if ((fp = fopen(transfile,"r")) == NULL)
	E_FATAL("Unable to open transcript file %s for reading!\n",transfile);

    E_INFO("Out of vocabulary words in transcript will be mapped to SIL!\n");

    lphnhash = (phnhashelement_t**)calloc(PHNHASHSIZE,sizeof(phnhashelement_t));

    n_totalwds = 0;
    nbwdtphns = newdtphns = niwdtphns = nswdtphns = 0;

    for (line = lineiter_start_clean(fp); line; line = lineiter_next(line)) {

	tline = strdup(line->buf);
        if (strtok(tline," \t\n") == NULL) {
           free(tline);
    	   continue;
        }

        /* Count number of phones in pronunciation */
        for(nwords=1; strtok(NULL," \t\n") != NULL; nwords++);
	n_totalwds += nwords;
	wordarr = (dicthashelement_t **)ckd_calloc(nwords+2,sizeof(dicthashelement_t*));
        word = strtok(line->buf," \t\n"); 
        if ((wordarr[1] = dictlookup(word,dicthash)) == NULL) {
            E_WARN("Word %s not found in dictionary. Mapping to SIL.\n", word);
        }
        for (j=2; (word = strtok(NULL," \t\n")) != NULL; j++) {
            if ((wordarr[j] = dictlookup(word,dicthash)) == NULL) {
                /* If word is surrounded by "()", assume it's the
                 * utterance ID, and don't report it as an OOV */
                if ((word[0] != '(') && (word[strlen(word) - 1] != ')')) {
                    E_WARN("Word %s not found in dictionary. Mapping to SIL.\n", word);
                }
            }
        }       
	for (i=1; i<=nwords; i++){/* Indices account for padded wordarr array */
	    if (wordarr[i] == NULL) continue;

	    lnphns = wordarr[i]->nphns;
	    if (lnphns == 1) {
		wpos = wordpos2str(WORD_POSN_SINGLE, ignore_wpos);
		basephone = wordarr[i]->phones[0];
		phnptr = phninstall(basephone,lphnhash);
		phnptr->count++;
		if (IS_FILLER(basephone)) continue;
		if (wordarr[i-1] != NULL){
		    lctxt = wordarr[i-1]->phones[wordarr[i-1]->nphns - 1];
		    if (IS_FILLER(lctxt)) lctxt = silencephn;
		}
		else lctxt = silencephn;
		if (wordarr[i+1] != NULL){
		    rctxt = wordarr[i+1]->phones[0];
		    if (IS_FILLER(rctxt)) rctxt = silencephn;
		}
		else rctxt = silencephn;
		tphnptr = lookup(basephone,lctxt,rctxt,wpos,tphnhash);
		(tphnptr->count)++;
		nswdtphns++;
	    }
	    else {
		wpos = wordpos2str(WORD_POSN_BEGIN, ignore_wpos);
		basephone = wordarr[i]->phones[0];
		phnptr = phninstall(basephone,lphnhash);
		phnptr->count++;
		if (IS_FILLER(basephone)) continue;
                if (!IS_FILLER(basephone)){
		    if (wordarr[i-1] != NULL){
		        lctxt = wordarr[i-1]->phones[wordarr[i-1]->nphns - 1];
		        if (IS_FILLER(lctxt)) lctxt = silencephn;
		    }
		    else lctxt = silencephn;
		    rctxt = wordarr[i]->phones[1];
		    if (IS_FILLER(rctxt)) rctxt = silencephn;
		    tphnptr = lookup(basephone,lctxt,rctxt,wpos,tphnhash);
		    (tphnptr->count)++; 
                    nbwdtphns++;
	        }
		wpos = wordpos2str(WORD_POSN_INTERNAL, ignore_wpos);
		for (j=1;j<lnphns-1;j++){
		    basephone = wordarr[i]->phones[j];
		    phnptr = phninstall(basephone,lphnhash);
		    phnptr->count++;
		    if (IS_FILLER(basephone)) continue;
		    lctxt = wordarr[i]->phones[j-1];
		    if (IS_FILLER(lctxt)) lctxt = silencephn;
		    rctxt = wordarr[i]->phones[j+1];
		    if (IS_FILLER(rctxt)) rctxt = silencephn;
		    tphnptr = lookup(basephone,lctxt,rctxt,wpos,tphnhash);
		    (tphnptr->count)++;
		    niwdtphns++;
		}

		wpos = wordpos2str(WORD_POSN_END, ignore_wpos);
		basephone = wordarr[i]->phones[lnphns-1];
		phnptr = phninstall(basephone,lphnhash);
		phnptr->count++;
		if (IS_FILLER(basephone)) continue;

		lctxt = wordarr[i]->phones[lnphns-2];
		if (IS_FILLER(lctxt)) lctxt = silencephn;
		if (wordarr[i+1] != NULL){
		    rctxt = wordarr[i+1]->phones[0];
		    if (IS_FILLER(rctxt)) rctxt = silencephn;
		}
		else rctxt = silencephn;
		tphnptr = lookup(basephone,lctxt,rctxt,wpos,tphnhash);
		(tphnptr->count)++;
		newdtphns++;
	    }
	}
        free(wordarr);
        free(tline);
    }
    fclose(fp);
    lineiter_free(line);

    *phnhash = lphnhash;
    E_INFO("%d words in transcripts\n",n_totalwds);
    E_INFO("%d single word triphones in transcripts\n",nswdtphns);
    E_INFO("%d word beginning triphones in transcripts\n",nbwdtphns);
    E_INFO("%d word internal triphones in transcripts\n",niwdtphns);
    E_INFO("%d word ending triphones in transcripts\n",newdtphns);

    return S3_SUCCESS;
}